

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

int ptls_handshake(ptls_t *tls,ptls_buffer_t *sendbuf,void *input,size_t *inlen,
                  ptls_handshake_properties_t *properties)

{
  size_t sVar1;
  int iVar2;
  uint8_t *puVar3;
  uint8_t local_19c;
  size_t local_180;
  size_t consumed;
  uint8_t decryptbuf_small [256];
  ptls_buffer_t decryptbuf;
  uint8_t *src_end;
  uint8_t *src;
  int ret;
  size_t sendbuf_orig_off;
  ptls_handshake_properties_t *properties_local;
  size_t *inlen_local;
  void *input_local;
  ptls_buffer_t *sendbuf_local;
  ptls_t *tls_local;
  
  sVar1 = sendbuf->off;
  if (PTLS_STATE_SERVER_EXPECT_FINISHED < tls->state) {
    __assert_fail("tls->state < PTLS_STATE_POST_HANDSHAKE_MIN",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/mattcaswell[P]picotls/t/../lib/picotls.c"
                  ,0x8e5,
                  "int ptls_handshake(ptls_t *, ptls_buffer_t *, const void *, size_t *, ptls_handshake_properties_t *)"
                 );
  }
  if (tls->state == PTLS_STATE_CLIENT_HANDSHAKE_START) {
    if ((input != (void *)0x0) && (*inlen != 0)) {
      __assert_fail("input == NULL || *inlen == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/mattcaswell[P]picotls/t/../lib/picotls.c"
                    ,0x8ea,
                    "int ptls_handshake(ptls_t *, ptls_buffer_t *, const void *, size_t *, ptls_handshake_properties_t *)"
                   );
    }
    tls_local._4_4_ = send_client_hello(tls,sendbuf,properties);
  }
  else {
    if (tls->state == PTLS_STATE_CLIENT_SEND_EARLY_DATA) {
      iVar2 = send_alert(tls,sendbuf,'\x01','\x01');
      if (iVar2 != 0) {
        return iVar2;
      }
      tls->state = PTLS_STATE_CLIENT_EXPECT_SERVER_HELLO;
    }
    puVar3 = (uint8_t *)((long)input + *inlen);
    ptls_buffer_init((ptls_buffer_t *)(decryptbuf_small + 0xf8),&consumed,0x100);
    src._4_4_ = 0x202;
    src_end = (uint8_t *)input;
    while (src._4_4_ == 0x202 && src_end != puVar3) {
      local_180 = (long)puVar3 - (long)src_end;
      src._4_4_ = handle_input(tls,sendbuf,(ptls_buffer_t *)(decryptbuf_small + 0xf8),src_end,
                               &local_180,properties);
      src_end = src_end + local_180;
      if (decryptbuf.capacity != 0) {
        __assert_fail("decryptbuf.off == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/mattcaswell[P]picotls/t/../lib/picotls.c"
                      ,0x901,
                      "int ptls_handshake(ptls_t *, ptls_buffer_t *, const void *, size_t *, ptls_handshake_properties_t *)"
                     );
      }
    }
    ptls_buffer_dispose((ptls_buffer_t *)(decryptbuf_small + 0xf8));
    if ((src._4_4_ == 0) && ((char)(*(char *)&(tls->field_7).server << 7) < '\0')) {
      *(byte *)&(tls->field_7).server = *(byte *)&(tls->field_7).server & 0xfe;
      src._4_4_ = send_session_ticket(tls,sendbuf);
    }
    if ((src._4_4_ != 0) && (src._4_4_ != 0x202)) {
      (*ptls_clear_memory)(sendbuf->base + sVar1,sendbuf->off - sVar1);
      sendbuf->off = sVar1;
      if ((src._4_4_ & 0xffffff00) != 0x100) {
        if ((src._4_4_ & 0xffffff00) == 0) {
          local_19c = (uint8_t)src._4_4_;
        }
        else {
          local_19c = 'P';
        }
        iVar2 = send_alert(tls,sendbuf,'\x02',local_19c);
        if (iVar2 != 0) {
          sendbuf->off = sVar1;
        }
      }
    }
    *inlen = *inlen - ((long)puVar3 - (long)src_end);
    tls_local._4_4_ = src._4_4_;
  }
  return tls_local._4_4_;
}

Assistant:

int ptls_handshake(ptls_t *tls, ptls_buffer_t *sendbuf, const void *input, size_t *inlen, ptls_handshake_properties_t *properties)
{
    size_t sendbuf_orig_off = sendbuf->off;
    int ret;

    assert(tls->state < PTLS_STATE_POST_HANDSHAKE_MIN);

    /* special handlings */
    switch (tls->state) {
    case PTLS_STATE_CLIENT_HANDSHAKE_START:
        assert(input == NULL || *inlen == 0);
        return send_client_hello(tls, sendbuf, properties);
    case PTLS_STATE_CLIENT_SEND_EARLY_DATA:
        if ((ret = send_alert(tls, sendbuf, PTLS_ALERT_LEVEL_WARNING, PTLS_ALERT_END_OF_EARLY_DATA)) != 0)
            return ret;
        tls->state = PTLS_STATE_CLIENT_EXPECT_SERVER_HELLO;
        break;
    default:
        break;
    }

    const uint8_t *src = input, *src_end = src + *inlen;
    ptls_buffer_t decryptbuf;
    uint8_t decryptbuf_small[256];

    ptls_buffer_init(&decryptbuf, decryptbuf_small, sizeof(decryptbuf_small));

    /* perform handhake until completion or until all the input has been swallowed */
    ret = PTLS_ERROR_HANDSHAKE_IN_PROGRESS;
    while (ret == PTLS_ERROR_HANDSHAKE_IN_PROGRESS && src != src_end) {
        size_t consumed = src_end - src;
        ret = handle_input(tls, sendbuf, &decryptbuf, src, &consumed, properties);
        src += consumed;
        assert(decryptbuf.off == 0);
    }

    ptls_buffer_dispose(&decryptbuf);

    if (ret == 0 && tls->server.send_ticket) {
        tls->server.send_ticket = 0;
        ret = send_session_ticket(tls, sendbuf);
    }

    if (!(ret == 0 || ret == PTLS_ERROR_HANDSHAKE_IN_PROGRESS)) {
        /* flush partially written response */
        ptls_clear_memory(sendbuf->base + sendbuf_orig_off, sendbuf->off - sendbuf_orig_off);
        sendbuf->off = sendbuf_orig_off;
        /* send alert immediately */
        if (PTLS_ERROR_GET_CLASS(ret) != PTLS_ERROR_CLASS_PEER_ALERT)
            if (send_alert(tls, sendbuf, PTLS_ALERT_LEVEL_FATAL,
                           PTLS_ERROR_GET_CLASS(ret) == PTLS_ERROR_CLASS_SELF_ALERT ? ret : PTLS_ALERT_INTERNAL_ERROR) != 0)
                sendbuf->off = sendbuf_orig_off;
    }

    *inlen -= src_end - src;
    return ret;
}